

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

void testLutHeader(void)

{
  LutHeaderWorker *pLVar1;
  undefined1 auVar2 [16];
  LutHeaderWorker *this;
  char cVar3;
  int iVar4;
  long lVar5;
  LutHeaderWorker *pLVar6;
  Thread *this_00;
  pointer ppRVar7;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t i;
  vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
  *in_RSI;
  size_t sVar8;
  ulong uVar9;
  size_t __n;
  size_t i_2;
  pointer __p;
  long lVar10;
  ulong uVar11;
  pointer ppLVar12;
  vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
  local_88;
  LutHeaderWorker *local_70;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  workers;
  
  workers.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  workers.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  workers.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = cpuCount();
  uVar11 = (ulong)iVar4;
  uVar9 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  lVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) / auVar2,0);
  while (uVar9 != uVar11) {
    if (uVar9 == uVar11 - 1) {
      pLVar6 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_29c88c::LutHeaderWorker::LutHeaderWorker
                (pLVar6,(uVar11 - 1) * lVar5,0x10000);
      in_RSI = &local_88;
      local_88.
      super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&workers,(value_type *)&local_88);
      uVar9 = uVar9 + 1;
    }
    else {
      pLVar6 = (LutHeaderWorker *)operator_new(0x30);
      sVar8 = uVar9 * lVar5;
      uVar9 = uVar9 + 1;
      anon_unknown.dwarf_29c88c::LutHeaderWorker::LutHeaderWorker(pLVar6,sVar8,uVar9 * lVar5);
      in_RSI = &local_88;
      local_88.
      super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&workers,(value_type *)&local_88);
    }
  }
  cVar3 = IlmThread_2_5::supportsThreads();
  ppLVar12 = workers.
             super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (cVar3 == '\0') {
    lVar10 = (long)workers.
                   super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)workers.
                   super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
      anon_unknown.dwarf_29c88c::LutHeaderWorker::run(ppLVar12[lVar5],SUB81(in_RSI,0));
    }
  }
  else {
    local_88.
    super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar5 = (long)workers.
                  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)workers.
                  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    pLVar6 = (LutHeaderWorker *)0x0;
    for (lVar10 = 0;
        pLVar1 = (LutHeaderWorker *)
                 local_88.
                 super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish, lVar5 != lVar10; lVar10 = lVar10 + 1) {
      local_70 = pLVar6;
      this_00 = (Thread *)operator_new(0x48);
      pLVar6 = ppLVar12[lVar10];
      IlmThread_2_5::Thread::Thread(this_00);
      *(undefined ***)this_00 = &PTR__Runner_00420bf0;
      *(LutHeaderWorker **)(this_00 + 0x10) = pLVar6;
      this_00[0x18] = (Thread)(lVar10 == 0);
      IlmThread_2_5::Semaphore::Semaphore((Semaphore *)(this_00 + 0x20),0);
      pLVar6 = local_70;
      IlmThread_2_5::Thread::start();
      if (pLVar1 == (LutHeaderWorker *)
                    local_88.
                    super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = (long)pLVar1 - (long)pLVar6;
        if (__n == 0x7ffffffffffffff8) {
          local_88.
          super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n >> 3);
        ppRVar7 = (pointer)0x1;
        if (pLVar1 != pLVar6) {
          ppRVar7 = __p;
        }
        uVar9 = (long)ppRVar7 + (long)__p;
        if (0xffffffffffffffe < uVar9) {
          uVar9 = 0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppRVar7,(ulong)__p)) {
          uVar9 = 0xfffffffffffffff;
        }
        if (uVar9 == 0) {
          pLVar6 = (LutHeaderWorker *)0x0;
          sVar8 = extraout_RDX;
        }
        else {
          pLVar6 = (LutHeaderWorker *)operator_new(uVar9 * 8);
          sVar8 = extraout_RDX_00;
        }
        this = local_70;
        (&pLVar6->_lastCandidateCount)[(long)__p] = (size_t)this_00;
        if (0 < (long)__n) {
          memmove(pLVar6,local_70,__n);
          sVar8 = extraout_RDX_01;
        }
        pLVar1 = (LutHeaderWorker *)(__n + (long)pLVar6);
        std::
        _Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
                         *)this,__p,sVar8);
        local_88.
        super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(&pLVar6->_lastCandidateCount + uVar9);
      }
      else {
        *&pLVar1->_lastCandidateCount = (size_t)this_00;
      }
      local_88.
      super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&pLVar1->_startValue;
    }
    local_88.
    super__Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6;
    for (lVar10 = 0; lVar5 != lVar10; lVar10 = lVar10 + 1) {
      if ((long *)(&pLVar6->_lastCandidateCount)[lVar10] != (long *)0x0) {
        (**(code **)(*(long *)(&pLVar6->_lastCandidateCount)[lVar10] + 8))();
      }
    }
    std::
    vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ::~vector(&local_88);
    lVar10 = (long)workers.
                   super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)workers.
                   super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    ppLVar12 = workers.
               super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  puts("test closestDataOffset[]");
  puts("test closestData[]");
  for (lVar5 = 0; lVar10 != lVar5; lVar5 = lVar5 + 1) {
    pLVar6 = ppLVar12[lVar5];
    if (pLVar6 != (LutHeaderWorker *)0x0) {
      if (pLVar6->_offset != (size_t *)0x0) {
        operator_delete__(pLVar6->_offset);
      }
      if (pLVar6->_elements != (unsigned_short *)0x0) {
        operator_delete__(pLVar6->_elements);
      }
    }
    operator_delete(pLVar6,0x30);
  }
  std::
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ::~vector(&workers);
  return;
}

Assistant:

size_t lastCandidateCount() const
    {
        return _lastCandidateCount;
    }